

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompiler.cpp
# Opt level: O2

ULONG __thiscall Diligent::anon_unknown_0::DxcBlobWrapper::Release(DxcBlobWrapper *this)

{
  atomic<long> *paVar1;
  long lVar2;
  ULONG UVar3;
  string local_30;
  
  LOCK();
  paVar1 = &this->m_RefCount;
  lVar2 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  UVar3 = lVar2 - 1;
  if (UVar3 == 0) {
    if ((this->m_RefCount).super___atomic_base<long>._M_i != 0) {
      FormatString<char[46]>
                (&local_30,(char (*) [46])"Destroying object with outstanding references");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"~DxcBlobWrapper",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompiler.cpp"
                 ,0x10c);
      std::__cxx11::string::~string((string *)&local_30);
    }
    RefCntAutoPtr<Diligent::IDataBlob>::Release(&this->m_pData);
    operator_delete(this,0x18);
  }
  return UVar3;
}

Assistant:

Release(void) override final
    {
        long RemainingRefs = m_RefCount.fetch_add(-1) - 1;
        if (RemainingRefs == 0)
            delete this;

        return RemainingRefs;
    }